

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall
GEO::PackedArrays::resize_array(PackedArrays *this,index_t array_index,index_t array_size,bool lock)

{
  byte *pbVar1;
  byte bVar2;
  index_t *piVar3;
  uint uVar4;
  undefined7 in_register_00000009;
  size_t __size;
  string local_60;
  string local_40;
  
  if (((int)CONCAT71(in_register_00000009,lock) != 0) && (this->thread_safe_ == true)) {
    LOCK();
    pbVar1 = (byte *)((long)(this->Z1_spinlocks_).spinlocks_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start +
                     ((long)(int)(array_index & 0x1f) >> 3) + (ulong)(array_index >> 5) * 4);
    bVar2 = *pbVar1 >> (array_index & 7);
    *pbVar1 = *pbVar1 | '\x01' << (array_index & 7);
    UNLOCK();
    while ((bVar2 & 1) != 0) {
      LOCK();
      pbVar1 = (byte *)((long)(this->Z1_spinlocks_).spinlocks_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                       ((long)(int)(array_index & 0x1f) >> 3) + (ulong)(array_index >> 5) * 4);
      bVar2 = *pbVar1 >> (array_index & 7);
      *pbVar1 = *pbVar1 | '\x01' << (array_index & 7);
      UNLOCK();
    }
  }
  uVar4 = this->Z1_stride_ * array_index;
  if (this->Z1_[uVar4] != array_size) {
    this->Z1_[uVar4] = array_size;
    uVar4 = this->Z1_block_size_;
    if (this->ZV_ == (index_t **)0x0) {
      if (uVar4 < array_size) {
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"array_size <= Z1_block_size_","");
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                   ,"");
        geo_assertion_failed(&local_40,&local_60,0x1842);
      }
    }
    else {
      __size = 0;
      if (uVar4 < array_size) {
        __size = (ulong)(array_size - uVar4) << 2;
      }
      piVar3 = (index_t *)realloc(this->ZV_[array_index],__size);
      this->ZV_[array_index] = piVar3;
    }
  }
  if ((lock) && (this->thread_safe_ == true)) {
    LOCK();
    pbVar1 = (byte *)((long)(this->Z1_spinlocks_).spinlocks_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start +
                     ((long)(int)(array_index & 0x1f) >> 3) + (ulong)(array_index >> 5) * 4);
    *pbVar1 = *pbVar1 & ~('\x01' << (array_index & 7));
    UNLOCK();
  }
  return;
}

Assistant:

void PackedArrays::resize_array(
        index_t array_index, index_t array_size, bool lock
    ) {
        geo_debug_assert(array_index < nb_arrays_);
        if(lock) {
            lock_array(array_index);
        }
        index_t* array_base = Z1_ + array_index * Z1_stride_;
        index_t old_array_size = *array_base;
        if(old_array_size != array_size) {
            *array_base = array_size;
            if(static_mode()) {
                geo_assert(array_size <= Z1_block_size_);
            } else {
                index_t nb_in_ZV =
                    (array_size > Z1_block_size_) ?
                    array_size - Z1_block_size_ : 0;
                ZV_[array_index] = (index_t*) realloc(
                    ZV_[array_index], sizeof(index_t) * nb_in_ZV
                );
            }
        }
        if(lock) {
            unlock_array(array_index);
        }
    }